

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O3

void __thiscall Component::Component(Component *this,path *path)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->root).m_pathname._M_dataplus._M_p = (pointer)&(this->root).m_pathname.field_2;
  pcVar2 = (path->m_pathname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + (path->m_pathname)._M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name);
  (this->pubDeps)._M_h._M_buckets = &(this->pubDeps)._M_h._M_single_bucket;
  (this->pubDeps)._M_h._M_bucket_count = 1;
  (this->pubDeps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pubDeps)._M_h._M_element_count = 0;
  (this->pubDeps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pubDeps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pubDeps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->privDeps)._M_h._M_buckets = &(this->privDeps)._M_h._M_single_bucket;
  (this->privDeps)._M_h._M_bucket_count = 1;
  (this->privDeps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->privDeps)._M_h._M_element_count = 0;
  (this->privDeps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->privDeps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->privDeps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pubLinks)._M_h._M_buckets = &(this->pubLinks)._M_h._M_single_bucket;
  (this->pubLinks)._M_h._M_bucket_count = 1;
  (this->pubLinks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pubLinks)._M_h._M_element_count = 0;
  (this->pubLinks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pubLinks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pubLinks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->privLinks)._M_h._M_buckets = &(this->privLinks)._M_h._M_single_bucket;
  (this->privLinks)._M_h._M_bucket_count = 1;
  (this->privLinks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->privLinks)._M_h._M_element_count = 0;
  (this->privLinks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->privLinks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->privLinks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->circulars)._M_h._M_buckets = &(this->circulars)._M_h._M_single_bucket;
  (this->circulars)._M_h._M_bucket_count = 1;
  (this->circulars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->circulars)._M_h._M_element_count = 0;
  (this->circulars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->circulars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->circulars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->buildAfters)._M_t._M_impl.super__Rb_tree_header;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->files)._M_h._M_buckets = &(this->files)._M_h._M_single_bucket;
  (this->files)._M_h._M_bucket_count = 1;
  (this->files)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->files)._M_h._M_element_count = 0;
  (this->files)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->files)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->files)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->recreate = false;
  this->hasAddonCmake = false;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->type,"add_library","");
  this->index = 0;
  this->lowlink = 0;
  (this->additionalTargetParameters)._M_dataplus._M_p =
       (pointer)&(this->additionalTargetParameters).field_2;
  (this->additionalTargetParameters)._M_string_length = 0;
  (this->additionalTargetParameters).field_2._M_local_buf[0] = '\0';
  (this->additionalCmakeDeclarations)._M_dataplus._M_p =
       (pointer)&(this->additionalCmakeDeclarations).field_2;
  (this->additionalCmakeDeclarations)._M_string_length = 0;
  (this->additionalCmakeDeclarations).field_2._M_local_buf[0] = '\0';
  this->onStack = false;
  return;
}

Assistant:

Component::Component(const filesystem::path &path)
        : root(path), name(""), recreate(false), hasAddonCmake(false), type("add_library"), index(0), lowlink(0), onStack(false) {
}